

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void custom_compare_variable_test(void)

{
  int iVar1;
  fdb_status fVar2;
  size_t sVar3;
  void *pvVar4;
  fdb_kvs_handle *in_stack_ffffffffffffdbb8;
  fdb_file_handle *in_stack_ffffffffffffdbc0;
  fdb_iterator *in_stack_ffffffffffffdbc8;
  size_t in_stack_ffffffffffffdbd0;
  void *in_stack_ffffffffffffdbd8;
  size_t in_stack_ffffffffffffdbe0;
  fdb_doc **in_stack_ffffffffffffdc30;
  fdb_iterator *in_stack_ffffffffffffdc38;
  fdb_custom_cmp_variable *in_stack_ffffffffffffddc0;
  char **in_stack_ffffffffffffddc8;
  size_t in_stack_ffffffffffffddd0;
  fdb_config *in_stack_ffffffffffffddd8;
  char *in_stack_ffffffffffffdde0;
  fdb_file_handle **in_stack_ffffffffffffdde8;
  void **in_stack_ffffffffffffde00;
  void *params [1];
  fdb_custom_cmp_variable functions [1];
  char *kvs_names [1];
  uint64_t user_param;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char prev_key [256];
  char bodybuf [256];
  char keybuf [256];
  size_t prev_keylen;
  size_t keylen;
  fdb_iterator *iterator;
  fdb_doc *pfStack_98;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int local_68;
  int count;
  int n;
  int r;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  local_68 = 1000;
  rdoc = (fdb_doc *)&stack0xffffffffffffdbb8;
  pfStack_98 = (fdb_doc *)0x0;
  count = system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.wal_flush_before_commit = true;
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fconfig.compactor_sleep_duration._0_1_ = 1;
  fdb_open(in_stack_ffffffffffffdde8,in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8);
  fdb_kvs_open_default
            (in_stack_ffffffffffffdbc0,(fdb_kvs_handle **)in_stack_ffffffffffffdbb8,
             (fdb_kvs_config *)0x112aa0);
  pvVar4 = (void *)0x112ab7;
  iterator._4_4_ = fdb_set_log_callback(db2,logCallbackFunc,"custom_compare_variable_test");
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    pvVar4 = (void *)0x112aea;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x9f6);
    custom_compare_variable_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x9f6,"void custom_compare_variable_test()");
    }
  }
  for (r = 0; r < local_68; r = r + 1) {
    for (n = 0; n < 2; n = n + 1) {
      iVar1 = rand();
      bodybuf[(long)n + 0xf8] = (char)(iVar1 % 0x19) + 'a';
    }
    sprintf(bodybuf + 0xfa,"%06d",(ulong)(uint)r);
    for (n = 8; (uint)n < 0xf; n = n + 1) {
      iVar1 = rand();
      bodybuf[(long)n + 0xf8] = (char)(iVar1 % 0x19) + 'a';
    }
    sprintf(prev_key + 0xf8,"value: %d",(ulong)(uint)r);
    pvVar4 = (void *)0x112c41;
    sVar3 = strlen(prev_key + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0,
                   (size_t)in_stack_ffffffffffffdbb8,pvVar4,sVar3 + 1,(void *)0x112c76,
                   in_stack_ffffffffffffdbe0);
    pvVar4 = (void *)0x112c92;
    fdb_set(db2,(fdb_doc *)(&rdoc->keylen)[r]);
  }
  r = 0;
  while( true ) {
    if (local_68 <= r) {
      fdb_iterator_init(db2,(fdb_iterator **)&keylen,(void *)0x0,0,(void *)0x0,0,0);
      sprintf((char *)&fconfig.num_blocks_readahead,"%016d",0);
      dbfile._4_4_ = 0;
      do {
        iterator._4_4_ = fdb_iterator_get(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
        if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa1b);
          custom_compare_variable_test::__test_pass = 0;
          if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa1b,"void custom_compare_variable_test()");
          }
        }
        iVar1 = _cmp_variable(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0,
                              in_stack_ffffffffffffdbc8,(size_t)in_stack_ffffffffffffdbc0,
                              in_stack_ffffffffffffdbb8);
        if (0 < iVar1) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa1e);
          custom_compare_variable_test::__test_pass = 0;
          iVar1 = _cmp_variable(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0,
                                in_stack_ffffffffffffdbc8,(size_t)in_stack_ffffffffffffdbc0,
                                in_stack_ffffffffffffdbb8);
          if (0 < iVar1) {
            __assert_fail("_cmp_variable(prev_key, prev_keylen, rdoc->key, rdoc->keylen, kvs_config.custom_cmp_param) <= 0"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa1e,"void custom_compare_variable_test()");
          }
        }
        memcpy(&fconfig.num_blocks_readahead,pfStack_98->key,pfStack_98->keylen);
        fdb_doc_free((fdb_doc *)0x11309c);
        pfStack_98 = (fdb_doc *)0x0;
        dbfile._4_4_ = dbfile._4_4_ + 1;
        fVar2 = fdb_iterator_next((fdb_iterator *)in_stack_ffffffffffffdbb8);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (dbfile._4_4_ != local_68) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xa25);
        custom_compare_variable_test::__test_pass = 0;
        if (dbfile._4_4_ != local_68) {
          __assert_fail("count == n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa25,"void custom_compare_variable_test()");
        }
      }
      fdb_iterator_close(in_stack_ffffffffffffdbc8);
      fdb_commit((fdb_file_handle *)in_stack_ffffffffffffdbb8,'\0');
      fdb_iterator_init(db2,(fdb_iterator **)&keylen,(void *)0x0,0,(void *)0x0,0,0);
      sprintf((char *)&fconfig.num_blocks_readahead,"%016d",0);
      dbfile._4_4_ = 0;
      do {
        iterator._4_4_ = fdb_iterator_get(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
        if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa31);
          custom_compare_variable_test::__test_pass = 0;
          if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa31,"void custom_compare_variable_test()");
          }
        }
        iVar1 = _cmp_variable(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0,
                              in_stack_ffffffffffffdbc8,(size_t)in_stack_ffffffffffffdbc0,
                              in_stack_ffffffffffffdbb8);
        if (0 < iVar1) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa34);
          custom_compare_variable_test::__test_pass = 0;
          iVar1 = _cmp_variable(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0,
                                in_stack_ffffffffffffdbc8,(size_t)in_stack_ffffffffffffdbc0,
                                in_stack_ffffffffffffdbb8);
          if (0 < iVar1) {
            __assert_fail("_cmp_variable(prev_key, prev_keylen, rdoc->key, rdoc->keylen, kvs_config.custom_cmp_param) <= 0"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa34,"void custom_compare_variable_test()");
          }
        }
        memcpy(&fconfig.num_blocks_readahead,pfStack_98->key,pfStack_98->keylen);
        fdb_doc_free((fdb_doc *)0x11330f);
        pfStack_98 = (fdb_doc *)0x0;
        dbfile._4_4_ = dbfile._4_4_ + 1;
        fVar2 = fdb_iterator_next((fdb_iterator *)in_stack_ffffffffffffdbb8);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (dbfile._4_4_ != local_68) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xa3b);
        custom_compare_variable_test::__test_pass = 0;
        if (dbfile._4_4_ != local_68) {
          __assert_fail("count == n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa3b,"void custom_compare_variable_test()");
        }
      }
      fdb_iterator_close(in_stack_ffffffffffffdbc8);
      fdb_compact(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
      fdb_iterator_init(db2,(fdb_iterator **)&keylen,(void *)0x0,0,(void *)0x0,0,0);
      sprintf((char *)&fconfig.num_blocks_readahead,"%016d",0);
      dbfile._4_4_ = 0;
      do {
        iterator._4_4_ = fdb_iterator_get(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
        if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa48);
          custom_compare_variable_test::__test_pass = 0;
          if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa48,"void custom_compare_variable_test()");
          }
        }
        iVar1 = _cmp_variable(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0,
                              in_stack_ffffffffffffdbc8,(size_t)in_stack_ffffffffffffdbc0,
                              in_stack_ffffffffffffdbb8);
        if (0 < iVar1) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa4b);
          custom_compare_variable_test::__test_pass = 0;
          iVar1 = _cmp_variable(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0,
                                in_stack_ffffffffffffdbc8,(size_t)in_stack_ffffffffffffdbc0,
                                in_stack_ffffffffffffdbb8);
          if (0 < iVar1) {
            __assert_fail("_cmp_variable(prev_key, prev_keylen, rdoc->key, rdoc->keylen, kvs_config.custom_cmp_param) <= 0"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa4b,"void custom_compare_variable_test()");
          }
        }
        memcpy(&fconfig.num_blocks_readahead,pfStack_98->key,pfStack_98->keylen);
        fdb_doc_free((fdb_doc *)0x113584);
        pfStack_98 = (fdb_doc *)0x0;
        dbfile._4_4_ = dbfile._4_4_ + 1;
        fVar2 = fdb_iterator_next((fdb_iterator *)in_stack_ffffffffffffdbb8);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (dbfile._4_4_ != local_68) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xa52);
        custom_compare_variable_test::__test_pass = 0;
        if (dbfile._4_4_ != local_68) {
          __assert_fail("count == n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa52,"void custom_compare_variable_test()");
        }
      }
      fdb_iterator_close(in_stack_ffffffffffffdbc8);
      fdb_iterator_sequence_init(db2,(fdb_iterator **)&keylen,0,0,0);
      dbfile._4_4_ = 0;
      do {
        iterator._4_4_ = fdb_iterator_get(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
        if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa5a);
          custom_compare_variable_test::__test_pass = 0;
          if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa5a,"void custom_compare_variable_test()");
          }
        }
        fdb_doc_free((fdb_doc *)0x1136c3);
        pfStack_98 = (fdb_doc *)0x0;
        dbfile._4_4_ = dbfile._4_4_ + 1;
        fVar2 = fdb_iterator_next((fdb_iterator *)in_stack_ffffffffffffdbb8);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (dbfile._4_4_ != local_68) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xa5f);
        custom_compare_variable_test::__test_pass = 0;
        if (dbfile._4_4_ != local_68) {
          __assert_fail("count == n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa5f,"void custom_compare_variable_test()");
        }
      }
      do {
        fVar2 = fdb_iterator_prev((fdb_iterator *)in_stack_ffffffffffffdbb8);
        if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
          if (dbfile._4_4_ != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xa68);
            custom_compare_variable_test::__test_pass = 0;
            if (dbfile._4_4_ != 0) {
              __assert_fail("count == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xa68,"void custom_compare_variable_test()");
            }
          }
          fdb_iterator_close(in_stack_ffffffffffffdbc8);
          pvVar4 = (void *)0x113898;
          fdb_kvs_open_default
                    (in_stack_ffffffffffffdbc0,(fdb_kvs_handle **)in_stack_ffffffffffffdbb8,
                     (fdb_kvs_config *)0x113898);
          r = 0;
          while( true ) {
            if (local_68 <= r) {
              fdb_kvs_close(in_stack_ffffffffffffdbb8);
              fdb_kvs_close(in_stack_ffffffffffffdbb8);
              fdb_close((fdb_file_handle *)in_stack_ffffffffffffdbb8);
              memset(functions,0,8);
              iterator._4_4_ =
                   fdb_open_custom_cmp(in_stack_ffffffffffffdde8,in_stack_ffffffffffffdde0,
                                       in_stack_ffffffffffffddd8,in_stack_ffffffffffffddd0,
                                       in_stack_ffffffffffffddc8,in_stack_ffffffffffffddc0,
                                       in_stack_ffffffffffffde00);
              if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa89);
                custom_compare_variable_test::__test_pass = 0;
                if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xa89,"void custom_compare_variable_test()");
                }
              }
              pvVar4 = (void *)0x113bc9;
              iterator._4_4_ =
                   fdb_kvs_open_default
                             (in_stack_ffffffffffffdbc0,(fdb_kvs_handle **)in_stack_ffffffffffffdbb8
                              ,(fdb_kvs_config *)0x113bc9);
              if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
                pvVar4 = (void *)0x113bfc;
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa8c);
                custom_compare_variable_test::__test_pass = 0;
                if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xa8c,"void custom_compare_variable_test()");
                }
              }
              r = 0;
              while( true ) {
                if (local_68 <= r) {
                  fdb_kvs_close(in_stack_ffffffffffffdbb8);
                  fdb_close((fdb_file_handle *)in_stack_ffffffffffffdbb8);
                  for (r = 0; r < local_68; r = r + 1) {
                    fdb_doc_free((fdb_doc *)0x113e94);
                  }
                  fdb_shutdown();
                  memleak_end();
                  if (custom_compare_variable_test::__test_pass == 0) {
                    fprintf(_stderr,"%s FAILED\n",
                            "custom compare function for variable length key test");
                  }
                  else {
                    fprintf(_stderr,"%s PASSED\n",
                            "custom compare function for variable length key test");
                  }
                  return;
                }
                fdb_doc_create((fdb_doc **)in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0,
                               (size_t)in_stack_ffffffffffffdbb8,pvVar4,0,(void *)0x113c8d,
                               in_stack_ffffffffffffdbe0);
                iterator._4_4_ = fdb_get(db2,pfStack_98);
                if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa93);
                  custom_compare_variable_test::__test_pass = 0;
                  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
                    __assert_fail("status == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                  ,0xa93,"void custom_compare_variable_test()");
                  }
                }
                if (pfStack_98->bodylen != *(size_t *)((&rdoc->keylen)[r] + 0x10)) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa94);
                  custom_compare_variable_test::__test_pass = 0;
                  if (pfStack_98->bodylen != *(size_t *)((&rdoc->keylen)[r] + 0x10)) {
                    __assert_fail("rdoc->bodylen == doc[i]->bodylen",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                  ,0xa94,"void custom_compare_variable_test()");
                  }
                }
                iVar1 = memcmp(pfStack_98->body,*(void **)((&rdoc->keylen)[r] + 0x40),
                               pfStack_98->bodylen);
                if (iVar1 != 0) break;
                pvVar4 = (void *)0x113e46;
                fdb_doc_free((fdb_doc *)0x113e46);
                pfStack_98 = (fdb_doc *)0x0;
                r = r + 1;
              }
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                      *(undefined8 *)((&rdoc->keylen)[r] + 0x40),pfStack_98->body,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa95);
              custom_compare_variable_test::__test_pass = 0;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xa95,"void custom_compare_variable_test()");
            }
            fdb_doc_create((fdb_doc **)in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0,
                           (size_t)in_stack_ffffffffffffdbb8,pvVar4,0,(void *)0x1138f3,
                           in_stack_ffffffffffffdbe0);
            iterator._4_4_ = fdb_get((fdb_kvs_handle *)doc,pfStack_98);
            if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa75);
              custom_compare_variable_test::__test_pass = 0;
              if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0xa75,"void custom_compare_variable_test()");
              }
            }
            if (pfStack_98->bodylen != *(size_t *)((&rdoc->keylen)[r] + 0x10)) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa76);
              custom_compare_variable_test::__test_pass = 0;
              if (pfStack_98->bodylen != *(size_t *)((&rdoc->keylen)[r] + 0x10)) {
                __assert_fail("rdoc->bodylen == doc[i]->bodylen",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0xa76,"void custom_compare_variable_test()");
              }
            }
            iVar1 = memcmp(pfStack_98->body,*(void **)((&rdoc->keylen)[r] + 0x40),
                           pfStack_98->bodylen);
            if (iVar1 != 0) break;
            pvVar4 = (void *)0x113aac;
            fdb_doc_free((fdb_doc *)0x113aac);
            pfStack_98 = (fdb_doc *)0x0;
            r = r + 1;
          }
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                  *(undefined8 *)((&rdoc->keylen)[r] + 0x40),pfStack_98->body,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa77);
          custom_compare_variable_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa77,"void custom_compare_variable_test()");
        }
        iterator._4_4_ = fdb_iterator_get(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
        if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa64);
          custom_compare_variable_test::__test_pass = 0;
          if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa64,"void custom_compare_variable_test()");
          }
        }
        fdb_doc_free((fdb_doc *)0x1137ec);
        pfStack_98 = (fdb_doc *)0x0;
        dbfile._4_4_ = dbfile._4_4_ + -1;
      } while( true );
    }
    fdb_doc_create((fdb_doc **)in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0,
                   (size_t)in_stack_ffffffffffffdbb8,pvVar4,0,(void *)0x112cfb,
                   in_stack_ffffffffffffdbe0);
    iterator._4_4_ = fdb_get(db2,pfStack_98);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xa0c);
      custom_compare_variable_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa0c,"void custom_compare_variable_test()");
      }
    }
    if (pfStack_98->bodylen != *(size_t *)((&rdoc->keylen)[r] + 0x10)) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xa0d);
      custom_compare_variable_test::__test_pass = 0;
      if (pfStack_98->bodylen != *(size_t *)((&rdoc->keylen)[r] + 0x10)) {
        __assert_fail("rdoc->bodylen == doc[i]->bodylen",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa0d,"void custom_compare_variable_test()");
      }
    }
    iVar1 = memcmp(pfStack_98->body,*(void **)((&rdoc->keylen)[r] + 0x40),pfStack_98->bodylen);
    if (iVar1 != 0) break;
    pvVar4 = (void *)0x112eb4;
    fdb_doc_free((fdb_doc *)0x112eb4);
    pfStack_98 = (fdb_doc *)0x0;
    r = r + 1;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
          *(undefined8 *)((&rdoc->keylen)[r] + 0x40),pfStack_98->body,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0xa0e);
  custom_compare_variable_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xa0e,"void custom_compare_variable_test()");
}

Assistant:

void custom_compare_variable_test()
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int n = 1000;
    int count;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *db2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    size_t keylen = 16;
    size_t prev_keylen;
    char keybuf[256], bodybuf[256];
    char prev_key[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.seqtree_opt = FDB_SEQTREE_USE;
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = true;

    uint64_t user_param = 0x1234;
    kvs_config.custom_cmp = _cmp_variable;
    kvs_config.custom_cmp_param = (void*)&user_param;

    // open db with custom compare function for variable length key type
    //fdb_open_cmp_variable(&dbfile, "./dummy1", &fconfig);
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "custom_compare_variable_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        for (j=0;j<2;++j){
            keybuf[j] = 'a' + rand()%('z'-'a');
        }
        sprintf(keybuf+2, "%06d", i);
        for (j=8;(size_t)j<keylen-1;++j){
            keybuf[j] = 'a' + rand()%('z'-'a');
        }
        keybuf[keylen-1] = 0;
        sprintf(bodybuf, "value: %d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, keylen, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        fdb_set(db, doc[i]);
    }

    // point query
    for (i=0;i<n;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(rdoc->bodylen == doc[i]->bodylen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // range scan (before flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    sprintf(prev_key, "%016d", 0);
    count = 0;
    prev_keylen = 16;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(_cmp_variable(prev_key, prev_keylen,
                               rdoc->key, rdoc->keylen,
                               kvs_config.custom_cmp_param) <= 0);
        prev_keylen = rdoc->keylen;
        memcpy(prev_key, rdoc->key, rdoc->keylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);
    fdb_iterator_close(iterator);

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // range scan (after flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    sprintf(prev_key, "%016d", 0);
    count = 0;
    prev_keylen = 16;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(_cmp_variable(prev_key, prev_keylen,
                               rdoc->key, rdoc->keylen,
                               kvs_config.custom_cmp_param) <= 0);
        prev_keylen = rdoc->keylen;
        memcpy(prev_key, rdoc->key, rdoc->keylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);
    fdb_iterator_close(iterator);

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // range scan (after compaction)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    sprintf(prev_key, "%016d", 0);
    count = 0;
    prev_keylen = 16;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(_cmp_variable(prev_key, prev_keylen,
                               rdoc->key, rdoc->keylen,
                               kvs_config.custom_cmp_param) <= 0);
        prev_keylen = rdoc->keylen;
        memcpy(prev_key, rdoc->key, rdoc->keylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);
    fdb_iterator_close(iterator);

    // range scan by sequence
    fdb_iterator_sequence_init(db, &iterator, 0, 0, 0x0);
    count = 0;
    do { // forward
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);

    // Reverse direction
    for (; fdb_iterator_prev(iterator) != FDB_RESULT_ITERATOR_FAIL; --count) {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    };
    TEST_CHK(count == 0);
    fdb_iterator_close(iterator);

    // open another handle
    kvs_config.custom_cmp = NULL;
    kvs_config.custom_cmp_param = NULL;
    fdb_kvs_open_default(dbfile, &db2, &kvs_config);

    // point query
    for (i=0;i<n;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(rdoc->bodylen == doc[i]->bodylen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_kvs_close(db);
    fdb_kvs_close(db2);
    fdb_close(dbfile);

    // re-open check
    //status = fdb_open(&dbfile, "./dummy2", &fconfig);
    char* kvs_names[1] = {NULL};
    fdb_custom_cmp_variable functions[1] = {_cmp_variable};
    void* params[1] = {(void*)&user_param};
    status = fdb_open_custom_cmp(&dbfile, "./dummy2", &fconfig,
                                 1, kvs_names, functions, params);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // point query
    for (i=0;i<n;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(rdoc->bodylen == doc[i]->bodylen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("custom compare function for variable length key test");
}